

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_packet.c
# Opt level: O0

uint16_t crcgen(char *payload,int length,int UAP)

{
  byte bVar1;
  ushort local_1e;
  ushort local_1c;
  uint16_t count;
  uint16_t reg;
  char bit;
  int UAP_local;
  int length_local;
  char *payload_local;
  
  bVar1 = reverse((char)UAP);
  local_1c = (ushort)bVar1 << 8;
  for (local_1e = 0; (int)(uint)local_1e < length; local_1e = local_1e + 1) {
    local_1c = (ushort)((int)(uint)local_1c >> 1) |
               (local_1c & 1 ^ (short)payload[local_1e] & 1U) << 0xf;
    local_1c = local_1c ^ (ushort)((int)(local_1c & 0x8000) >> 5);
    local_1c = local_1c ^ (ushort)((int)(local_1c & 0x8000) >> 0xc);
  }
  return local_1c;
}

Assistant:

static uint16_t crcgen(char *payload, int length, int UAP)
{
	char bit;
	uint16_t reg, count;

	reg = (reverse(UAP) << 8) & 0xff00;
	for(count = 0; count < length; count++)
	{
		bit = payload[count];

		reg = (reg >> 1) | (((reg & 0x0001) ^ (bit & 0x01))<<15);

		/*Bit 5*/
		reg ^= ((reg & 0x8000)>>5);

		/*Bit 12*/
		reg ^= ((reg & 0x8000)>>12);
	}
	return reg;
}